

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

GenerateRegionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::GenerateRegionSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::MemberSyntax>&,slang::parsing::Token>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,SyntaxList<slang::syntax::MemberSyntax> *args_2,Token *args_3)

{
  Token keyword;
  Token endgenerate;
  GenerateRegionSyntax *pGVar1;
  Info *in_RCX;
  undefined8 *in_RDX;
  undefined8 in_RSI;
  Info *in_RDI;
  long in_R8;
  size_t in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  BumpAllocator *in_stack_ffffffffffffffb8;
  
  pGVar1 = (GenerateRegionSyntax *)
           allocate(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  keyword.info = in_RCX;
  keyword.kind = (short)in_R8;
  keyword._2_1_ = (char)((ulong)in_R8 >> 0x10);
  keyword.numFlags.raw = (char)((ulong)in_R8 >> 0x18);
  keyword.rawLen = (int)((ulong)in_R8 >> 0x20);
  endgenerate.info = in_RDI;
  endgenerate.kind = (short)in_RSI;
  endgenerate._2_1_ = (char)((ulong)in_RSI >> 0x10);
  endgenerate.numFlags.raw = (char)((ulong)in_RSI >> 0x18);
  endgenerate.rawLen = (int)((ulong)in_RSI >> 0x20);
  slang::syntax::GenerateRegionSyntax::GenerateRegionSyntax
            ((GenerateRegionSyntax *)in_RDX[1],
             (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)*in_RDX,keyword,
             *(SyntaxList<slang::syntax::MemberSyntax> **)(in_R8 + 8),endgenerate);
  return pGVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }